

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void fullinc(lua_State *L,global_State *g)

{
  if (g->gcstate < 3) {
    entersweep(L);
  }
  luaC_runtilstate(L,8,1);
  luaC_runtilstate(L,7,1);
  luaC_runtilstate(L,8,1);
  setpause(g);
  return;
}

Assistant:

static void fullinc (lua_State *L, global_State *g) {
  if (keepinvariant(g))  /* black objects? */
    entersweep(L); /* sweep everything to turn them back to white */
  /* finish any pending sweep phase to start a new cycle */
  luaC_runtilstate(L, GCSpause, 1);
  luaC_runtilstate(L, GCScallfin, 1);  /* run up to finalizers */
  luaC_runtilstate(L, GCSpause, 1);  /* finish collection */
  setpause(g);
}